

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

void __thiscall slang::SourceManager::SourceManager(SourceManager *this)

{
  _Rb_tree_header *p_Var1;
  value_type_pointer ppVar2;
  size_t sVar3;
  FileInfo file;
  FileInfo local_68;
  
  memset(this,0,0x88);
  (this->lookupCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->lookupCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->lookupCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->lookupCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->lookupCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  ppVar2 = (this->lookupCache).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
           .arrays.elements_;
  sVar3 = 0x1d;
  if (ppVar2 != (value_type_pointer)0x0) {
    ppVar2 = (value_type_pointer)0x1d;
  }
  (this->lookupCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
  .size_ctrl.ml = (size_t)ppVar2;
  p_Var1 = &(this->directories)._M_t._M_impl.super__Rb_tree_header;
  (this->directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->lookupCache).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>,_slang::hash<std::__cxx11::basic_string<char>_>,_std::equal_to<std::__cxx11::basic_string<char>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char>,_std::pair<std::unique_ptr<slang::SourceManager::FileData>,_std::error_code>_>_>_>
  .size_ctrl.size = 0;
  (this->systemDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->systemDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->systemDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->userDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->userDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->userDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->directories)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->directories)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->diagDirectives).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
  .arrays.groups_size_index = 0x3f;
  (this->diagDirectives).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
  .arrays.groups_size_mask = 1;
  (this->diagDirectives).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  (this->diagDirectives).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  (this->diagDirectives).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  if ((this->diagDirectives).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
      .arrays.elements_ == (value_type_pointer)0x0) {
    sVar3 = 0;
  }
  (this->diagDirectives).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
  .size_ctrl.ml = sVar3;
  (this->diagDirectives).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>,_slang::hash<slang::BufferID>,_std::equal_to<slang::BufferID>,_std::allocator<std::pair<const_slang::BufferID,_std::vector<slang::SourceManager::DiagnosticDirectiveInfo>_>_>_>
  .size_ctrl.size = 0;
  (this->unnamedBufferCount).super___atomic_base<unsigned_int>._M_i = 0;
  this->disableProximatePaths = false;
  local_68.lineDirectives.
  super__Vector_base<slang::SourceManager::LineDirectiveInfo,_std::allocator<slang::SourceManager::LineDirectiveInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.lineDirectives.
  super__Vector_base<slang::SourceManager::LineDirectiveInfo,_std::allocator<slang::SourceManager::LineDirectiveInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.lineDirectives.
  super__Vector_base<slang::SourceManager::LineDirectiveInfo,_std::allocator<slang::SourceManager::LineDirectiveInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.includedFrom = (SourceLocation)0x0;
  local_68.sortKey = 0;
  local_68.data = (FileData *)0x0;
  local_68.library = (SourceLibrary *)0x0;
  std::
  vector<std::variant<slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>,std::allocator<std::variant<slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>>>
  ::emplace_back<slang::SourceManager::FileInfo&>
            ((vector<std::variant<slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>,std::allocator<std::variant<slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>>>
              *)&this->bufferEntries,&local_68);
  std::
  vector<slang::SourceManager::LineDirectiveInfo,_std::allocator<slang::SourceManager::LineDirectiveInfo>_>
  ::~vector(&local_68.lineDirectives);
  return;
}

Assistant:

SourceManager::SourceManager() {
    // add a dummy entry to the start of the directory list so that our file IDs line up
    FileInfo file;
    bufferEntries.emplace_back(file);
}